

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneContextMenuEvent::QGraphicsSceneContextMenuEvent
          (QGraphicsSceneContextMenuEvent *this,Type type)

{
  QGraphicsSceneContextMenuEventPrivate *this_00;
  undefined4 in_ESI;
  QGraphicsSceneEventPrivate *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = (QGraphicsSceneContextMenuEventPrivate *)operator_new(0x50);
  QGraphicsSceneContextMenuEventPrivate::QGraphicsSceneContextMenuEventPrivate(this_00);
  QGraphicsSceneEvent::QGraphicsSceneEvent
            ((QGraphicsSceneEvent *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI,
             (Type)((ulong)this_00 >> 0x20));
  in_RDI->_vptr_QGraphicsSceneEventPrivate =
       (_func_int **)&PTR__QGraphicsSceneContextMenuEvent_00d34af0;
  return;
}

Assistant:

QGraphicsSceneContextMenuEvent::QGraphicsSceneContextMenuEvent(Type type)
    : QGraphicsSceneEvent(*new QGraphicsSceneContextMenuEventPrivate, type)
{
}